

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 MemPoolBucketAlloc(SyMemBackend *pBackend,sxu32 nBucket)

{
  uint uVar1;
  SyMemHeader *pSVar2;
  SyMemHeader SStack_38;
  sxu32 nBucketSize;
  SyMemHeader *pHeader;
  char *zBucketEnd;
  char *zBucket;
  sxu32 nBucket_local;
  SyMemBackend *pBackend_local;
  
  SStack_38.pNext = (SyMemHeader *)MemBackendAlloc(pBackend,0x8000);
  if (SStack_38 == (SyMemHeader)0x0) {
    pBackend_local._4_4_ = -1;
  }
  else {
    pSVar2 = SStack_38.pNext + 0x1000;
    uVar1 = 1 << ((char)nBucket + 3U & 0x1f);
    pBackend->apPool[nBucket] = (SyMemHeader *)SStack_38;
    for (zBucketEnd = (char *)SStack_38.pNext; (SyMemHeader *)(zBucketEnd + uVar1) < pSVar2;
        zBucketEnd = zBucketEnd + uVar1) {
      *SStack_38.pNext = (SyMemHeader *)(zBucketEnd + uVar1);
      SStack_38.pNext = *(SyMemHeader **)SStack_38.pNext;
    }
    *SStack_38.pNext = (SyMemHeader)0x0;
    pBackend_local._4_4_ = 0;
  }
  return pBackend_local._4_4_;
}

Assistant:

static sxi32 MemPoolBucketAlloc(SyMemBackend *pBackend, sxu32 nBucket)
{
	char *zBucket, *zBucketEnd;
	SyMemHeader *pHeader;
	sxu32 nBucketSize;
	
	/* Allocate one big block first */
	zBucket = (char *)MemBackendAlloc(&(*pBackend), SXMEM_POOL_MAXALLOC);
	if( zBucket == 0 ){
		return SXERR_MEM;
	}
	zBucketEnd = &zBucket[SXMEM_POOL_MAXALLOC];
	/* Divide the big block into mini bucket pool */
	nBucketSize = 1 << (nBucket + SXMEM_POOL_INCR);
	pBackend->apPool[nBucket] = pHeader = (SyMemHeader *)zBucket;
	for(;;){
		if( &zBucket[nBucketSize] >= zBucketEnd ){
			break;
		}
		pHeader->pNext = (SyMemHeader *)&zBucket[nBucketSize];
		/* Advance the cursor to the next available chunk */
		pHeader = pHeader->pNext;
		zBucket += nBucketSize;	
	}
	pHeader->pNext = 0;
	
	return SXRET_OK;
}